

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int inputSize)

{
  long *pInLimit;
  uint uVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long *plVar13;
  long *plVar14;
  ulong uVar15;
  BYTE *s;
  long *pIn;
  BYTE *src;
  long *plVar16;
  char *in_R8;
  uint uVar17;
  char *pcVar18;
  U32 *hashTable;
  char *pcVar19;
  U32 *hashTable_1;
  char *local_a8;
  char *local_a0;
  char *local_88;
  
  src = (BYTE *)((ulong)(uint)LZ4_dict->table[0x803] + LZ4_dict->table[0x801]);
  if (source < src) {
    src = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_dict,src);
  iVar3 = 0;
  if ((uint)inputSize < 0x7e000001) {
    local_a8 = dest;
    pIn = (long *)source;
    if (0xc < inputSize) {
      uVar1 = (uint)LZ4_dict->table[0x803];
      pcVar18 = (char *)LZ4_dict->table[0x801];
      plVar4 = (long *)(source + (long)inputSize + -0xc);
      pInLimit = (long *)(source + (long)inputSize + -5);
      uVar17 = (uint)LZ4_dict->table[0x800];
      lVar10 = (long)source - (ulong)uVar17;
      *(uint *)((long)LZ4_dict->table +
               (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
           uVar17;
      plVar14 = (long *)(source + 1);
      uVar17 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
      pcVar7 = (char *)0x0;
      local_88 = in_R8;
      pcVar19 = source;
      do {
        uVar12 = 0x40;
        uVar9 = 1;
        while( true ) {
          plVar16 = (long *)((ulong)uVar9 + (long)plVar14);
          iVar3 = (int)lVar10;
          if (plVar4 < plVar16) {
            iVar8 = 3;
          }
          else {
            uVar15 = (ulong)uVar17;
            local_88 = (char *)((ulong)*(uint *)((long)LZ4_dict->table + uVar15 * 4) + lVar10);
            iVar8 = 0;
            pcVar19 = source;
            pcVar7 = (char *)0x0;
            if (local_88 < source) {
              pcVar19 = pcVar18;
              pcVar7 = pcVar18 + ((ulong)uVar1 - (long)source);
            }
            uVar17 = (uint)((ulong)(*plVar16 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
            *(int *)((long)LZ4_dict->table + uVar15 * 4) = (int)plVar14 - iVar3;
          }
          if (plVar4 < plVar16) goto LAB_00154568;
          if ((plVar14 <= local_88 + 0xffff) && (*(int *)(local_88 + (long)pcVar7) == (int)*plVar14)
             ) break;
          uVar9 = uVar12 >> 6;
          uVar12 = uVar12 + 1;
          plVar14 = plVar16;
        }
        iVar8 = 0;
LAB_00154568:
        if (iVar8 == 0) {
          if ((pIn < plVar14) && (pcVar19 < local_88 + (long)pcVar7)) {
            pcVar5 = local_88;
            do {
              plVar16 = (long *)((long)plVar14 + -1);
              local_88 = pcVar5;
              if ((*(char *)plVar16 != pcVar5[(long)(pcVar7 + -1)]) ||
                 (local_88 = pcVar5 + -1, plVar14 = plVar16, plVar16 <= pIn)) break;
              pcVar6 = pcVar5 + (long)(pcVar7 + -1);
              pcVar5 = local_88;
            } while (pcVar19 < pcVar6);
          }
          uVar15 = (long)plVar14 - (long)pIn;
          plVar16 = (long *)(local_a8 + 1);
          if ((uint)uVar15 < 0xf) {
            *local_a8 = (char)uVar15 << 4;
          }
          else {
            iVar8 = (uint)uVar15 - 0xf;
            *local_a8 = -0x10;
            if (0xfe < iVar8) {
              if (0x1fc < iVar8) {
                iVar8 = 0x1fd;
              }
              uVar9 = ((int)plVar14 - (iVar8 + (int)pIn)) + 0xef;
              uVar11 = (ulong)uVar9 / 0xff;
              memset(plVar16,0xff,(ulong)(uVar9 / 0xff + 1));
              plVar16 = (long *)(local_a8 + uVar11 + 2);
              iVar8 = ((int)plVar14 - (int)pIn) + (int)uVar11 * -0xff + -0x10e;
            }
            *(char *)plVar16 = (char)iVar8;
            plVar16 = (long *)((long)plVar16 + 1);
          }
          plVar13 = (long *)((uVar15 & 0xffffffff) + (long)plVar16);
          do {
            *plVar16 = *pIn;
            plVar16 = plVar16 + 1;
            pIn = pIn + 1;
          } while (plVar16 < plVar13);
          local_a0 = local_a8;
          pIn = plVar14;
          while( true ) {
            *(short *)plVar13 = (short)pIn - (short)local_88;
            if (pcVar19 == pcVar18) {
              pcVar5 = local_88 + (long)pcVar7;
              plVar14 = (long *)(pcVar18 + ((ulong)uVar1 - (long)pcVar5) + (long)pIn);
              if (pInLimit < pcVar18 + ((ulong)uVar1 - (long)pcVar5) + (long)pIn) {
                plVar14 = pInLimit;
              }
              uVar9 = LZ4_count((BYTE *)((long)pIn + 4),(BYTE *)(local_88 + (long)(pcVar7 + 4)),
                                (BYTE *)plVar14);
              pIn = (long *)((long)pIn + (ulong)(uVar9 + 4));
              local_88 = pcVar5;
              if (pIn == plVar14) {
                uVar12 = LZ4_count((BYTE *)pIn,(BYTE *)source,(BYTE *)pInLimit);
                uVar9 = uVar9 + uVar12;
                pIn = (long *)((long)pIn + (ulong)uVar12);
              }
            }
            else {
              uVar9 = LZ4_count((BYTE *)((long)pIn + 4),(BYTE *)(local_88 + 4),(BYTE *)pInLimit);
              pIn = (long *)((long)pIn + (ulong)(uVar9 + 4));
            }
            local_a8 = (char *)((long)plVar13 + 2);
            if (uVar9 < 0xf) {
              *local_a0 = *local_a0 + (char)uVar9;
            }
            else {
              *local_a0 = *local_a0 + '\x0f';
              uVar12 = uVar9 - 0xf;
              if (0x1fd < uVar12) {
                uVar12 = uVar9 - 0x20d;
                uVar2 = (uVar12 / 0x1fe) * 2;
                memset(local_a8,0xff,(ulong)((uVar12 / 0x1fe) * 2 + 2));
                uVar12 = (uVar2 + (uVar12 / 0x1fe) * -0x200 + uVar9) - 0x20d;
                local_a8 = (char *)((long)plVar13 + (ulong)uVar2 + 4);
              }
              if (0xfe < uVar12) {
                uVar12 = uVar12 - 0xff;
                *local_a8 = -1;
                local_a8 = local_a8 + 1;
              }
              *local_a8 = (char)uVar12;
              local_a8 = local_a8 + 1;
            }
            if (plVar4 < pIn) {
              iVar8 = 4;
              plVar14 = pIn;
              goto LAB_001548ac;
            }
            *(int *)((long)LZ4_dict->table +
                    (ulong)((uint)((ulong)(*(long *)((long)pIn + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                           0xfff) * 4) = ((int)pIn + -2) - iVar3;
            uVar15 = (ulong)((uint)((ulong)(*pIn * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar11 = (ulong)*(uint *)((long)LZ4_dict->table + uVar15 * 4);
            local_88 = (char *)(lVar10 + uVar11);
            pcVar19 = source;
            pcVar7 = (char *)0x0;
            if (local_88 < source) {
              pcVar19 = pcVar18;
              pcVar7 = pcVar18 + ((ulong)uVar1 - (long)source);
            }
            *(int *)((long)LZ4_dict->table + uVar15 * 4) = (int)pIn - iVar3;
            if (((long *)(lVar10 + uVar11 + 0xffff) < pIn) ||
               (*(int *)(local_88 + (long)pcVar7) != (int)*pIn)) break;
            plVar13 = (long *)(local_a8 + 1);
            *local_a8 = '\0';
            local_a0 = local_a8;
          }
          uVar17 = (uint)((ulong)(*(long *)((long)pIn + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
          iVar8 = 0;
          plVar14 = (long *)((long)pIn + 1);
        }
LAB_001548ac:
      } while (iVar8 == 0);
      if (1 < iVar8 - 3U) {
        iVar3 = 0;
        goto LAB_00154972;
      }
    }
    pcVar18 = source + ((long)inputSize - (long)pIn);
    if (pcVar18 < (char *)0xf) {
      *local_a8 = (char)pcVar18 << 4;
    }
    else {
      pcVar7 = pcVar18 + -0xf;
      *local_a8 = -0x10;
      pcVar19 = local_a8 + 1;
      if ((char *)0xfe < pcVar7) {
        uVar15 = (ulong)(pcVar18 + -0x10e) / 0xff;
        memset(local_a8 + 1,0xff,uVar15 + 1);
        pcVar7 = pcVar18 + uVar15 * -0xff + -0x10e;
        pcVar19 = local_a8 + uVar15 + 2;
      }
      local_a8 = pcVar19;
      *local_a8 = (char)pcVar7;
    }
    memcpy(local_a8 + 1,pIn,(size_t)pcVar18);
    iVar3 = ((int)(local_a8 + 1) + (int)pcVar18) - (int)dest;
  }
LAB_00154972:
  LZ4_dict->table[0x801] = (longlong)source;
  *(int *)(LZ4_dict->table + 0x803) = inputSize;
  *(int *)(LZ4_dict->table + 0x800) = (int)LZ4_dict->table[0x800] + inputSize;
  return iVar3;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int inputSize)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_dict;
    int result;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = dictEnd;
    if (smallest > (const BYTE*) source) smallest = (const BYTE*) source;
    LZ4_renormDictT((LZ4_stream_t_internal*)LZ4_dict, smallest);

    result = LZ4_compress_generic(LZ4_dict, source, dest, inputSize, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)inputSize;
    streamPtr->currentOffset += (U32)inputSize;

    return result;
}